

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

IReporter *
doctest::detail::reporterCreator<doctest::(anonymous_namespace)::XmlReporter>(ContextOptions *o)

{
  XmlReporter *this;
  ContextOptions *o_local;
  
  this = (XmlReporter *)operator_new(0x88);
  anon_unknown_14::XmlReporter::XmlReporter(this,o);
  return &this->super_IReporter;
}

Assistant:

IReporter* reporterCreator(const ContextOptions& o) {
        return new Reporter(o);
    }